

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceFile.cpp
# Opt level: O0

void __thiscall hdc::SourceFile::addImport(SourceFile *this,Import *import)

{
  Import *local_18;
  Import *import_local;
  SourceFile *this_local;
  
  local_18 = import;
  import_local = (Import *)this;
  std::vector<hdc::Import_*,_std::allocator<hdc::Import_*>_>::push_back(&this->imports,&local_18);
  ASTNode::setParentNode(&local_18->super_ASTNode,&this->super_ASTNode);
  return;
}

Assistant:

void SourceFile::addImport(Import* import) {
    imports.push_back(import);
    import->setParentNode(this);
}